

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.cpp
# Opt level: O0

void __thiscall rsg::TokenStream::TokenStream(TokenStream *this)

{
  allocator<rsg::Token> local_11;
  TokenStream *local_10;
  TokenStream *this_local;
  
  local_10 = this;
  std::allocator<rsg::Token>::allocator(&local_11);
  std::vector<rsg::Token,_std::allocator<rsg::Token>_>::vector(&this->m_tokens,0x40,&local_11);
  std::allocator<rsg::Token>::~allocator(&local_11);
  this->m_numTokens = 0;
  return;
}

Assistant:

TokenStream::TokenStream (void)
	: m_tokens		(ALLOC_SIZE)
	, m_numTokens	(0)
{
}